

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranLexer.cxx
# Opt level: O2

void cmFortran_yy_flush_buffer(YY_BUFFER_STATE b,yyscan_t yyscanner)

{
  YY_BUFFER_STATE pyVar1;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    b->yy_n_chars = 0;
    pyVar1 = (YY_BUFFER_STATE)0x0;
    *b->yy_ch_buf = '\0';
    b->yy_ch_buf[1] = '\0';
    b->yy_buf_pos = b->yy_ch_buf;
    b->yy_at_bol = 1;
    b->yy_buffer_status = 0;
    if (*(long *)((long)yyscanner + 0x28) != 0) {
      pyVar1 = *(YY_BUFFER_STATE *)
                (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
    }
    if (pyVar1 == b) {
      cmFortran_yy_load_buffer_state(yyscanner);
      return;
    }
  }
  return;
}

Assistant:

void yy_flush_buffer (YY_BUFFER_STATE  b , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if ( ! b )
		return;

	b->yy_n_chars = 0;

	/* We always need two end-of-buffer characters.  The first causes
	 * a transition to the end-of-buffer state.  The second causes
	 * a jam in that state.
	 */
	b->yy_ch_buf[0] = YY_END_OF_BUFFER_CHAR;
	b->yy_ch_buf[1] = YY_END_OF_BUFFER_CHAR;

	b->yy_buf_pos = &b->yy_ch_buf[0];

	b->yy_at_bol = 1;
	b->yy_buffer_status = YY_BUFFER_NEW;

	if ( b == YY_CURRENT_BUFFER )
		yy_load_buffer_state( yyscanner );
}